

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O2

void fake_a_rnd(int min,int max,int column)

{
  long in_RAX;
  long len;
  
  len = in_RAX;
  dss_random(&len,(long)min,(long)max,(long)column);
  NthElement((len / 5 + 1) - (ulong)(len % 5 == 0),&Seed[column].usage);
  return;
}

Assistant:

void
fake_a_rnd(int min, int max, int column)
{
   long len, itcount;
   RANDOM(len, (long)min, (long)max, (long)column);
   if (len % 5L == 0)
      itcount = len/5;
   else itcount = len/5 + 1L;
   NthElement(itcount, &Seed[column].usage);
   return;
}